

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O2

ChQuaternion<double> * chrono::Qcross(ChQuaternion<double> *qa,ChQuaternion<double> *qb)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  ChQuaternion<double> *res;
  ChQuaternion<double> *in_RDI;
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  
  auVar6._8_8_ = 0;
  auVar6._0_8_ = qa->m_data[1];
  auVar2 = *(undefined1 (*) [16])(qa->m_data + 2);
  auVar12._24_8_ = qb->m_data[1];
  auVar12._16_8_ = qb->m_data[1];
  auVar10._0_8_ = -qa->m_data[1];
  auVar10._8_8_ = 0x8000000000000000;
  auVar3 = vpermpd_avx2(*(undefined1 (*) [32])qb->m_data,1);
  auVar8._0_8_ = -auVar2._0_8_;
  auVar8._8_8_ = -auVar2._8_8_;
  auVar4 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])(qb->m_data + 2)),0x15);
  auVar6 = vunpcklpd_avx(auVar10,auVar6);
  auVar7._16_16_ = auVar2;
  auVar7._0_16_ = auVar6;
  auVar5._0_8_ = auVar3._0_8_ * auVar6._0_8_;
  auVar5._8_8_ = auVar3._8_8_ * auVar6._8_8_;
  auVar5._16_8_ = auVar3._16_8_ * auVar2._0_8_;
  auVar5._24_8_ = auVar3._24_8_ * auVar2._8_8_;
  dVar1 = qa->m_data[0];
  auVar3._8_8_ = dVar1;
  auVar3._0_8_ = dVar1;
  auVar3._16_8_ = dVar1;
  auVar3._24_8_ = dVar1;
  auVar5 = vfmadd231pd_avx512vl(auVar5,*(undefined1 (*) [32])qb->m_data,auVar3);
  auVar11._24_8_ = qa->m_data[3];
  auVar11._16_8_ = qa->m_data[3];
  auVar12._8_8_ = qb->m_data[2];
  auVar12._0_8_ = qb->m_data[2];
  auVar3 = vpermpd_avx2(auVar7,0x66);
  auVar11._0_16_ = auVar8;
  auVar9._16_16_ = auVar10;
  auVar9._0_16_ = auVar8;
  auVar3 = vshufpd_avx(auVar9,auVar3,9);
  auVar7 = vpermpd_avx2(auVar11,0x24);
  auVar2 = vfmadd213pd_fma(auVar12,auVar7,auVar5);
  auVar2 = vfmadd213pd_fma(auVar3,auVar4,ZEXT1632(auVar2));
  *(undefined1 (*) [32])in_RDI->m_data = ZEXT1632(auVar2);
  return in_RDI;
}

Assistant:

ChQuaternion<double> Qcross(const ChQuaternion<double>& qa, const ChQuaternion<double>& qb) {
    ChQuaternion<double> res;
    res.e0() = qa.e0() * qb.e0() - qa.e1() * qb.e1() - qa.e2() * qb.e2() - qa.e3() * qb.e3();
    res.e1() = qa.e0() * qb.e1() + qa.e1() * qb.e0() - qa.e3() * qb.e2() + qa.e2() * qb.e3();
    res.e2() = qa.e0() * qb.e2() + qa.e2() * qb.e0() + qa.e3() * qb.e1() - qa.e1() * qb.e3();
    res.e3() = qa.e0() * qb.e3() + qa.e3() * qb.e0() - qa.e2() * qb.e1() + qa.e1() * qb.e2();
    return (res);
}